

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperEQ<std::tuple<int,double>,std::tuple<int,double>>
          (internal *this,char *expected_expression,char *actual_expression,
          tuple<int,_double> *expected,tuple<int,_double> *actual)

{
  double dVar1;
  AssertionResult AVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  if ((((expected->super__Tuple_impl<0UL,_int,_double>).super__Head_base<0UL,_int,_false>.
        _M_head_impl !=
        (actual->super__Tuple_impl<0UL,_int,_double>).super__Head_base<0UL,_int,_false>._M_head_impl
       ) || (dVar1 = (expected->super__Tuple_impl<0UL,_int,_double>).super__Tuple_impl<1UL,_double>.
                     super__Head_base<1UL,_double,_false>._M_head_impl,
            dVar1 != (actual->super__Tuple_impl<0UL,_int,_double>).super__Tuple_impl<1UL,_double>.
                     super__Head_base<1UL,_double,_false>._M_head_impl)) ||
     (NAN(dVar1) ||
      NAN((actual->super__Tuple_impl<0UL,_int,_double>).super__Tuple_impl<1UL,_double>.
          super__Head_base<1UL,_double,_false>._M_head_impl))) {
    AVar3 = CmpHelperEQFailure<std::tuple<int,double>,std::tuple<int,double>>
                      (this,expected_expression,actual_expression,expected,actual);
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
GTEST_DISABLE_MSC_WARNINGS_PUSH_(4389 /* signed/unsigned mismatch */)
  if (expected == actual) {
    return AssertionSuccess();
  }
GTEST_DISABLE_MSC_WARNINGS_POP_()

  return CmpHelperEQFailure(expected_expression, actual_expression, expected,
                            actual);
}